

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

void __thiscall
wasm::IRBuilder::setDebugLocation(IRBuilder *this,optional<wasm::Function::DebugLocation> *loc)

{
  bool bVar1;
  DebugLocation *__rhs;
  NoDebug local_19;
  optional *local_18;
  optional<wasm::Function::DebugLocation> *loc_local;
  IRBuilder *this_local;
  
  local_18 = (optional *)loc;
  loc_local = (optional<wasm::Function::DebugLocation> *)this;
  std::optional::operator_cast_to_bool((optional *)loc);
  bVar1 = std::optional::operator_cast_to_bool(local_18);
  if (bVar1) {
    __rhs = std::optional<wasm::Function::DebugLocation>::operator*
                      ((optional<wasm::Function::DebugLocation> *)local_18);
    std::
    variant<wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
    ::operator=((variant<wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
                 *)&this->debugLoc,__rhs);
  }
  else {
    std::
    variant<wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
    ::operator=((variant<wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
                 *)&this->debugLoc,&local_19);
  }
  return;
}

Assistant:

void IRBuilder::setDebugLocation(
  const std::optional<Function::DebugLocation>& loc) {
  if (loc) {
    DBG(std::cerr << "setting debugloc " << loc->fileIndex << ":"
                  << loc->lineNumber << ":" << loc->columnNumber << "\n";);
  } else {
    DBG(std::cerr << "setting debugloc to none\n";);
  }
  if (loc) {
    debugLoc = *loc;
  } else {
    debugLoc = NoDebug();
  }
}